

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  istream *piVar1;
  ostream *poVar2;
  int fb;
  int fa;
  string sb;
  string sa;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> b;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> a;
  int local_c0;
  int local_bc;
  undefined1 *local_b8;
  long local_b0;
  undefined1 local_a8;
  undefined7 uStack_a7;
  undefined1 *local_98;
  long local_90;
  undefined1 local_88;
  undefined7 uStack_87;
  undefined1 local_78 [8];
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  undefined1 local_50 [8];
  _Alloc_hider local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  local_90 = 0;
  local_88 = 0;
  local_b0 = 0;
  local_a8 = 0;
  local_b8 = &local_a8;
  local_98 = &local_88;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter CP::pair<int,string> A: ",0x1e);
  piVar1 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_bc);
  std::operator>>(piVar1,(string *)&local_98);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter CP::pair<int,string> B: ",0x1e);
  piVar1 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_c0);
  std::operator>>(piVar1,(string *)&local_b8);
  local_50._0_4_ = local_bc;
  local_48._M_p = (pointer)&local_38;
  std::__cxx11::string::_M_construct<char*>((string *)&local_48,local_98,local_98 + local_90);
  local_78._0_4_ = local_c0;
  local_70._M_p = (pointer)&local_60;
  std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_b8,local_b8 + local_b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Result of a >= b is ",0x14);
  CP::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator>=((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_50,
             (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_78);
  poVar2 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Result of b >= a is ",0x14);
  CP::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator>=((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_78,
             (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_50);
  poVar2 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_p != &local_60) {
    operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_p != &local_38) {
    operator_delete(local_48._M_p,local_38._M_allocated_capacity + 1);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,CONCAT71(uStack_a7,local_a8) + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
  }
  return 0;
}

Assistant:

int main() {
    int fa,fb;
    std::string sa,sb;

    std::cout << "Enter CP::pair<int,string> A: ";
    std::cin >> fa >> sa;
    std::cout << "Enter CP::pair<int,string> B: ";
    std::cin >> fb >> sb;

    CP::pair<int,std::string> a(fa,sa), b(fb,sb);

    std::cout << "Result of a >= b is " << (a >= b) << std::endl;
    std::cout << "Result of b >= a is " << (b >= a) << std::endl;
}